

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long_double_*,_10>::TPZManVector
          (TPZManVector<long_double_*,_10> *this,TPZManVector<long_double_*,_10> *copy)

{
  ulong uVar1;
  longdouble **pplVar2;
  ulong uVar3;
  
  (this->super_TPZVec<long_double_*>).fStore = (longdouble **)0x0;
  (this->super_TPZVec<long_double_*>).fNElements = 0;
  (this->super_TPZVec<long_double_*>).fNAlloc = 0;
  (this->super_TPZVec<long_double_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a258;
  uVar1 = (copy->super_TPZVec<long_double_*>).fNElements;
  if ((long)uVar1 < 0xb) {
    (this->super_TPZVec<long_double_*>).fStore = this->fExtAlloc;
    (this->super_TPZVec<long_double_*>).fNElements = uVar1;
    (this->super_TPZVec<long_double_*>).fNAlloc = 0;
    if ((long)uVar1 < 1) {
      return;
    }
  }
  else {
    pplVar2 = (longdouble **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->super_TPZVec<long_double_*>).fStore = pplVar2;
    (this->super_TPZVec<long_double_*>).fNElements = uVar1;
    (this->super_TPZVec<long_double_*>).fNAlloc = uVar1;
  }
  uVar3 = 0;
  do {
    (this->super_TPZVec<long_double_*>).fStore[uVar3] =
         (copy->super_TPZVec<long_double_*>).fStore[uVar3];
    uVar3 = uVar3 + 1;
  } while (uVar1 != uVar3);
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}